

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O1

int archive_write_set_format_cpio_newc(archive *_a)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_cpio_newc");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if ((code *)_a[2].archive_format_name != (code *)0x0) {
      (*(code *)_a[2].archive_format_name)(_a);
    }
    pvVar2 = calloc(1,0x28);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate cpio data");
    }
    else {
      _a[1].read_data_offset = (int64_t)pvVar2;
      _a[1].read_data_output_offset = (int64_t)"cpio";
      *(code **)&_a[1].read_data_is_posix_read = archive_write_newc_options;
      *(code **)(_a + 2) = archive_write_newc_header;
      _a[2].vtable = (archive_vtable_conflict *)archive_write_newc_data;
      _a[1].read_data_requested = (size_t)archive_write_newc_finish_entry;
      *(code **)&_a[2].archive_format = archive_write_newc_close;
      _a[2].archive_format_name = (char *)archive_write_newc_free;
      _a->archive_format = 0x10004;
      _a->archive_format_name = "SVR4 cpio nocrc";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_cpio_newc(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct cpio *cpio;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_cpio_newc");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	cpio = (struct cpio *)calloc(1, sizeof(*cpio));
	if (cpio == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate cpio data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = cpio;
	a->format_name = "cpio";
	a->format_options = archive_write_newc_options;
	a->format_write_header = archive_write_newc_header;
	a->format_write_data = archive_write_newc_data;
	a->format_finish_entry = archive_write_newc_finish_entry;
	a->format_close = archive_write_newc_close;
	a->format_free = archive_write_newc_free;
	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_NOCRC;
	a->archive.archive_format_name = "SVR4 cpio nocrc";
	return (ARCHIVE_OK);
}